

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

void __thiscall cmDependsFortran::MatchLocalModules(cmDependsFortran *this)

{
  cmDependsFortranInternals *pcVar1;
  _Base_ptr p_Var2;
  
  pcVar1 = this->Internal;
  for (p_Var2 = (pcVar1->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(pcVar1->TargetProvides)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    ConsiderModule(this,(string *)(p_Var2 + 1),&(this->super_cmDepends).TargetDirectory);
  }
  return;
}

Assistant:

void cmDependsFortran::MatchLocalModules()
{
  std::string const& stampDir = this->TargetDirectory;
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for (std::string const& i : provides) {
    this->ConsiderModule(i, stampDir);
  }
}